

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

int httplib::detail::select_read(socket_t sock,size_t sec,size_t usec)

{
  uint __i;
  int iVar1;
  long lVar2;
  undefined1 local_98 [8];
  fd_set fds;
  timeval tv;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2 + -1] = 0;
  }
  fds.fds_bits[(long)(sock / 0x40) + -1] =
       fds.fds_bits[(long)(sock / 0x40) + -1] | 1L << ((byte)sock & 0x3f);
  fds.fds_bits[0xf] = sec;
  iVar1 = select(sock + 1,(fd_set *)local_98,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)(fds.fds_bits + 0xf));
  return iVar1;
}

Assistant:

inline int select_read(socket_t sock, size_t sec, size_t usec)
{
    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(sock, &fds);

    timeval tv;
    tv.tv_sec = sec;
    tv.tv_usec = usec;

    return select(sock + 1, &fds, NULL, NULL, &tv);
}